

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedFieldIteratorTest_MutableIteration_Test::
~RepeatedFieldIteratorTest_MutableIteration_Test
          (RepeatedFieldIteratorTest_MutableIteration_Test *this)

{
  (this->super_RepeatedFieldIteratorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__RepeatedFieldIteratorTest_01916980;
  RepeatedField<int>::~RepeatedField(&(this->super_RepeatedFieldIteratorTest).proto_array_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(RepeatedFieldIteratorTest, MutableIteration) {
  RepeatedField<int>::iterator iter = proto_array_.begin();
  EXPECT_EQ(0, *iter);
  ++iter;
  EXPECT_EQ(1, *iter++);
  EXPECT_EQ(2, *iter);
  ++iter;
  EXPECT_TRUE(proto_array_.end() == iter);

  EXPECT_EQ(2, *(proto_array_.end() - 1));
}